

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkrequestfactory.cpp
# Opt level: O0

void __thiscall
QNetworkRequestFactory::setAttribute
          (QNetworkRequestFactory *this,Attribute attribute,QVariant *value)

{
  bool bVar1;
  QMessageLogger *in_RDX;
  uint in_ESI;
  QLoggingCategory *in_RDI;
  long in_FS_OFFSET;
  QLoggingCategoryMacroHolder<(QtMsgType)1> qt_category;
  QExplicitlySharedDataPointer<QNetworkRequestFactoryPrivate> *this_00;
  undefined1 in_stack_ffffffffffffffa0 [16];
  char local_40 [36];
  uint local_1c;
  undefined8 local_18;
  ulong local_10;
  long local_8;
  
  this_00 = in_stack_ffffffffffffffa0._0_8_;
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (((((in_ESI == 0) || (in_ESI == 1)) || (in_ESI == 2)) || ((in_ESI == 3 || (in_ESI == 6)))) ||
     ((in_ESI == 9 || ((in_ESI == 0x14 || (in_ESI == 0x15)))))) {
    local_18 = 0xaaaaaaaaaaaaaaaa;
    local_10 = 0xaaaaaaaaaaaaaaaa;
    local_1c = in_ESI;
    lcQrequestfactory();
    anon_unknown.dwarf_7c5ef5::QLoggingCategoryMacroHolder<(QtMsgType)1>::
    QLoggingCategoryMacroHolder(in_stack_ffffffffffffffa0._0_8_,in_RDI);
    while (bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                             ((QLoggingCategoryMacroHolder *)&local_18), bVar1) {
      anon_unknown.dwarf_7c5ef5::QLoggingCategoryMacroHolder<(QtMsgType)1>::name
                ((QLoggingCategoryMacroHolder<(QtMsgType)1> *)0x328219);
      QMessageLogger::QMessageLogger
                (in_RDX,in_stack_ffffffffffffffa0._8_8_,in_stack_ffffffffffffffa0._4_4_,
                 (char *)in_RDI,(char *)0x32822f);
      QMessageLogger::warning(local_40,"%i is a reply-only attribute, ignoring.",(ulong)local_1c);
      local_10 = local_10 & 0xffffffffffffff00;
    }
  }
  else {
    QExplicitlySharedDataPointer<QNetworkRequestFactoryPrivate>::detach(this_00);
    QExplicitlySharedDataPointer<QNetworkRequestFactoryPrivate>::operator->
              ((QExplicitlySharedDataPointer<QNetworkRequestFactoryPrivate> *)0x328261);
    QHash<QNetworkRequest::Attribute,_QVariant>::insert
              ((QHash<QNetworkRequest::Attribute,_QVariant> *)this_00,(Attribute *)in_RDI,
               (QVariant *)0x32827a);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QNetworkRequestFactory::setAttribute(QNetworkRequest::Attribute attribute,
                                          const QVariant &value)
{
    if (attribute == QNetworkRequest::HttpStatusCodeAttribute
        || attribute == QNetworkRequest::HttpReasonPhraseAttribute
        || attribute == QNetworkRequest::RedirectionTargetAttribute
        || attribute == QNetworkRequest::ConnectionEncryptedAttribute
        || attribute == QNetworkRequest::SourceIsFromCacheAttribute
        || attribute == QNetworkRequest::HttpPipeliningWasUsedAttribute
        || attribute == QNetworkRequest::Http2WasUsedAttribute
        || attribute == QNetworkRequest::OriginalContentLengthAttribute)
    {
        qCWarning(lcQrequestfactory, "%i is a reply-only attribute, ignoring.", attribute);
        return;
    }
    d.detach();
    d->attributes.insert(attribute, value);
}